

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

poptContext poptGetContext(char *name,int argc,char **argv,poptOption *options,uint flags)

{
  poptContext con_00;
  poptArgv ppcVar1;
  char *pcVar2;
  size_t sVar3;
  poptContext con;
  uint flags_local;
  poptOption *options_local;
  char **argv_local;
  int argc_local;
  char *name_local;
  
  con_00 = (poptContext)malloc(800);
  if (con_00 == (poptContext)0x0) {
    return (poptContext)0x0;
  }
  memset(con_00,0,800);
  con_00->os = (optionStackEntry *)con_00;
  con_00->os->argc = argc;
  con_00->os->argv = argv;
  con_00->os->argb = (pbm_set *)0x0;
  if ((flags & 2) == 0) {
    con_00->os->next = 1;
  }
  ppcVar1 = (poptArgv)calloc((long)(argc + 1),8);
  con_00->leftovers = ppcVar1;
  con_00->allocLeftovers = argc + 1;
  con_00->options = options;
  con_00->aliases = (poptItem)0x0;
  con_00->numAliases = 0;
  con_00->flags = flags;
  con_00->execs = (poptItem)0x0;
  con_00->numExecs = 0;
  con_00->execFail = (char *)0x0;
  con_00->finalArgvAlloced = argc << 1;
  ppcVar1 = (poptArgv)calloc((long)con_00->finalArgvAlloced,8);
  con_00->finalArgv = ppcVar1;
  con_00->execAbsolute = 1;
  con_00->arg_strip = (pbm_set *)0x0;
  pcVar2 = getenv("POSIXLY_CORRECT");
  if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("POSIX_ME_HARDER"), pcVar2 != (char *)0x0)) {
    con_00->flags = con_00->flags | 4;
  }
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    pcVar2 = (char *)malloc(sVar3 + 1);
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"virtual memory exhausted.\n");
      exit(1);
    }
    pcVar2 = strcpy(pcVar2,name);
    con_00->appName = pcVar2;
  }
  invokeCallbacksPRE(con_00,con_00->options);
  return con_00;
}

Assistant:

poptContext poptGetContext(const char * name, int argc, const char ** argv,
			const struct poptOption * options, unsigned int flags)
{
    poptContext con = malloc(sizeof(*con));

    if (con == NULL) return NULL;	/* XXX can't happen */
    memset(con, 0, sizeof(*con));

    con->os = con->optionStack;
    con->os->argc = argc;
    con->os->argv = argv;
    con->os->argb = NULL;

    if (!(flags & POPT_CONTEXT_KEEP_FIRST))
	con->os->next = 1;		/* skip argv[0] */

    con->leftovers = calloc( (size_t)(argc + 1), sizeof(*con->leftovers) );
    con->allocLeftovers = argc + 1;
    con->options = options;
    con->aliases = NULL;
    con->numAliases = 0;
    con->flags = flags;
    con->execs = NULL;
    con->numExecs = 0;
    con->execFail = NULL;
    con->finalArgvAlloced = argc * 2;
    con->finalArgv = calloc( (size_t)con->finalArgvAlloced, sizeof(*con->finalArgv) );
    con->execAbsolute = 1;
    con->arg_strip = NULL;

    if (getenv("POSIXLY_CORRECT") || getenv("POSIX_ME_HARDER"))
	con->flags |= POPT_CONTEXT_POSIXMEHARDER;

    if (name)
	con->appName = xstrdup(name);

    invokeCallbacksPRE(con, con->options);

    return con;
}